

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

void indicate_all_messages_as_error(MESSAGE_SENDER_INSTANCE *message_sender)

{
  ASYNC_OPERATION_HANDLE *__ptr;
  ASYNC_OPERATION_HANDLE pAVar1;
  ulong uVar2;
  
  for (uVar2 = 0; __ptr = message_sender->messages, uVar2 < message_sender->message_count;
      uVar2 = uVar2 + 1) {
    pAVar1 = __ptr[uVar2];
    if (pAVar1[2].async_operation_cancel_handler != (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0) {
      (*pAVar1[2].async_operation_cancel_handler)
                ((ASYNC_OPERATION_HANDLE)pAVar1[3].async_operation_cancel_handler);
    }
    if ((MESSAGE_HANDLE)pAVar1[1].async_operation_cancel_handler != (MESSAGE_HANDLE)0x0) {
      message_destroy((MESSAGE_HANDLE)pAVar1[1].async_operation_cancel_handler);
    }
    async_operation_destroy(message_sender->messages[uVar2]);
  }
  if (__ptr != (ASYNC_OPERATION_HANDLE *)0x0) {
    message_sender->message_count = 0;
    free(__ptr);
    message_sender->messages = (ASYNC_OPERATION_HANDLE *)0x0;
  }
  return;
}

Assistant:

static void indicate_all_messages_as_error(MESSAGE_SENDER_INSTANCE* message_sender)
{
    size_t i;

    for (i = 0; i < message_sender->message_count; i++)
    {
        MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, message_sender->messages[i]);
        if (message_with_callback->on_message_send_complete != NULL)
        {
            message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_ERROR, NULL);
        }

        if (message_with_callback->message != NULL)
        {
            message_destroy(message_with_callback->message);
        }
        async_operation_destroy(message_sender->messages[i]);
    }

    if (message_sender->messages != NULL)
    {
        message_sender->message_count = 0;

        free(message_sender->messages);
        message_sender->messages = NULL;
    }
}